

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::compute::anon_unknown_0::SSBOBarrierTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SSBOBarrierTestInstance *this)

{
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout VVar1;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)14>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  RefData<vk::Handle<(vk::HandleType)18>_> data_06;
  RefData<vk::Handle<(vk::HandleType)24>_> data_07;
  RefData<vk::VkCommandBuffer_s_*> data_08;
  deUint32 queueFamilyIndex_00;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  Allocation *pAVar8;
  undefined4 *puVar9;
  VkDeviceMemory VVar10;
  VkDeviceSize VVar11;
  DescriptorSetLayoutBuilder *pDVar12;
  DescriptorPoolBuilder *pDVar13;
  Handle<(vk::HandleType)21> *pHVar14;
  Handle<(vk::HandleType)19> *pHVar15;
  VkBuffer *pVVar16;
  Handle<(vk::HandleType)22> *pHVar17;
  DescriptorSetUpdateBuilder *pDVar18;
  ProgramCollection<vk::ProgramBinary> *pPVar19;
  ProgramBinary *pPVar20;
  Handle<(vk::HandleType)16> *pHVar21;
  Handle<(vk::HandleType)14> *pHVar22;
  Handle<(vk::HandleType)24> *pHVar23;
  VkCommandBuffer_s **ppVVar24;
  Handle<(vk::HandleType)18> *pHVar25;
  uint *puVar26;
  ostream *poVar27;
  IVec3 *pIVar28;
  allocator<char> local_a31;
  string local_a30;
  undefined4 local_a0c;
  string local_a08;
  ostringstream local_9e8 [8];
  ostringstream msg;
  int local_86c;
  uint local_868;
  int ndx;
  deUint32 ref;
  deUint32 res;
  deUint32 *bufferPtr;
  Allocation *outputBufferAllocation;
  Move<vk::VkCommandBuffer_s_*> local_828;
  RefData<vk::VkCommandBuffer_s_*> local_808;
  undefined1 local_7e8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_7a8;
  undefined1 local_788 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_760 [8];
  VkBufferMemoryBarrier afterComputeBarrier;
  undefined1 local_720 [8];
  VkBufferMemoryBarrier betweenShadersBarrier;
  undefined1 local_6e0 [8];
  VkBufferMemoryBarrier writeUniformConstantsBarrier;
  Move<vk::Handle<(vk::HandleType)18>_> local_698;
  RefData<vk::Handle<(vk::HandleType)18>_> local_678;
  undefined1 local_658 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline1;
  Move<vk::Handle<(vk::HandleType)18>_> local_628;
  RefData<vk::Handle<(vk::HandleType)18>_> local_608;
  undefined1 local_5e8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline0;
  Move<vk::Handle<(vk::HandleType)16>_> local_5c0;
  RefData<vk::Handle<(vk::HandleType)16>_> local_5a0;
  undefined1 local_580 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_558;
  Move<vk::Handle<(vk::HandleType)14>_> local_538;
  RefData<vk::Handle<(vk::HandleType)14>_> local_518;
  undefined1 local_4f8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule1;
  string local_4d0;
  Move<vk::Handle<(vk::HandleType)14>_> local_4b0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_490;
  undefined1 local_470 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule0;
  Location local_440;
  VkDescriptorSet local_438;
  Location local_430;
  VkDescriptorSet local_428;
  DescriptorSetUpdateBuilder local_420;
  deUint64 local_3d8;
  undefined1 local_3d0 [8];
  VkDescriptorBufferInfo uniformBufferDescriptorInfo;
  undefined1 local_3b0 [8];
  VkDescriptorBufferInfo outputBufferDescriptorInfo;
  undefined1 local_390 [8];
  VkDescriptorBufferInfo workBufferDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_368;
  RefData<vk::Handle<(vk::HandleType)22>_> local_348;
  undefined1 local_328 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_2f0;
  RefData<vk::Handle<(vk::HandleType)21>_> local_2d0;
  undefined1 local_2b0 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_248;
  RefData<vk::Handle<(vk::HandleType)19>_> local_228;
  undefined1 local_208 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  deUint32 *uniformBufferPtr;
  Allocation *uniformBufferAllocation;
  deUint32 baseValue;
  undefined1 local_190 [8];
  Buffer uniformBuffer;
  VkDeviceSize uniformBufferSizeBytes;
  deUint32 *outputBufferPtr;
  Allocation *outputBufferAllocation_1;
  VkBufferCreateInfo local_130;
  undefined1 local_f8 [8];
  Buffer outputBuffer;
  VkDeviceSize outputBufferSizeBytes;
  VkBufferCreateInfo local_b8;
  undefined1 local_80 [8];
  Buffer workBuffer;
  VkDeviceSize workBufferSizeBytes;
  int workGroupCount;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  SSBOBarrierTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  iVar4 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_workSize);
  workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)((long)iVar4 << 2);
  makeBufferCreateInfo
            (&local_b8,
             (VkDeviceSize)
             workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,0x20);
  compute::Buffer::Buffer
            ((Buffer *)local_80,vk_00,device_00,allocator_00,&local_b8,::vk::MemoryRequirement::Any)
  ;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x4;
  makeBufferCreateInfo(&local_130,4,0x20);
  compute::Buffer::Buffer
            ((Buffer *)local_f8,vk_00,device_00,allocator_00,&local_130,
             ::vk::MemoryRequirement::HostVisible);
  pAVar8 = compute::Buffer::getAllocation((Buffer *)local_f8);
  puVar9 = (undefined4 *)::vk::Allocation::getHostPtr(pAVar8);
  *puVar9 = 0;
  VVar10 = ::vk::Allocation::getMemory(pAVar8);
  VVar11 = ::vk::Allocation::getOffset(pAVar8);
  ::vk::flushMappedMemoryRange(vk_00,device_00,VVar10,VVar11,4);
  uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&baseValue,4,0x10);
  compute::Buffer::Buffer
            ((Buffer *)local_190,vk_00,device_00,allocator_00,(VkBufferCreateInfo *)&baseValue,
             ::vk::MemoryRequirement::HostVisible);
  pAVar8 = compute::Buffer::getAllocation((Buffer *)local_190);
  puVar9 = (undefined4 *)::vk::Allocation::getHostPtr(pAVar8);
  *puVar9 = 0x7f;
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar8);
  VVar11 = ::vk::Allocation::getOffset(pAVar8);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,
             (VkDeviceMemory)
             descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
             m_allocator,VVar11,4);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar12,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar12,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_248,pDVar12,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_228,(Move *)&local_248);
  data.deleter.m_deviceIface._0_4_ = (int)local_228.deleter.m_deviceIface;
  data.object.m_internal = local_228.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_228.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_228.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_228.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_228.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_208,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_248);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType(pDVar13,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_2f0,pDVar13,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d0,(Move *)&local_2f0);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_2d0.deleter.m_deviceIface;
  data_00.object.m_internal = local_2d0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_2d0.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_2d0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_2d0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_2b0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_2f0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_2b0);
  descriptorPool_00.m_internal = pHVar14->m_internal;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_208);
  workBufferDescriptorInfo.range = pHVar15->m_internal;
  makeDescriptorSet(&local_368,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)workBufferDescriptorInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_348,(Move *)&local_368);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_348.deleter.m_deviceIface;
  data_01.object.m_internal = local_348.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_348.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_348.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_348.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_348.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_328,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_368);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_80);
  outputBufferDescriptorInfo.range = pVVar16->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_390,(VkBuffer)outputBufferDescriptorInfo.range,0,
             (VkDeviceSize)
             workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_f8);
  uniformBufferDescriptorInfo.range = pVVar16->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_3b0,(VkBuffer)uniformBufferDescriptorInfo.range,0,4);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_190);
  local_3d8 = pVVar16->m_internal;
  ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_3d0,(VkBuffer)local_3d8,0,4);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_420);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_328);
  local_428.m_internal = pHVar17->m_internal;
  local_430 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_420,local_428,&local_430,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_3b0);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_328);
  local_438.m_internal = pHVar17->m_internal;
  local_440 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar18,local_438,&local_440,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_390);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_328);
  destSet.m_internal = pHVar17->m_internal;
  shaderModule0.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(2);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar18,destSet,
                       (Location *)
                       &shaderModule0.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       (VkDescriptorBufferInfo *)local_3d0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_420);
  pPVar19 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"comp0",
             (allocator<char> *)
             ((long)&shaderModule1.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar20 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar19,&local_4d0);
  ::vk::createShaderModule(&local_4b0,vk_00,device_00,pPVar20,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_490,(Move *)&local_4b0);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_490.deleter.m_deviceIface;
  data_02.object.m_internal = local_490.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_490.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_490.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_490.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_490.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_470,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&shaderModule1.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar19 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"comp1",
             (allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar20 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar19,&local_558);
  ::vk::createShaderModule(&local_538,vk_00,device_00,pPVar20,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_518,(Move *)&local_538);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_518.deleter.m_deviceIface;
  data_03.object.m_internal = local_518.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_518.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_518.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_518.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_518.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_4f8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_538);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_208);
  pipeline0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar15->m_internal;
  makePipelineLayout(&local_5c0,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     pipeline0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5a0,(Move *)&local_5c0);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_5a0.deleter.m_deviceIface;
  data_04.object.m_internal = local_5a0.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5a0.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_5a0.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_5a0.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_5a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_580,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_5c0);
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_580);
  VVar1.m_internal = pHVar21->m_internal;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_470);
  pipeline1.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar22->m_internal;
  makeComputePipeline(&local_628,vk_00,device_00,VVar1,
                      (VkShaderModule)
                      pipeline1.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_608,(Move *)&local_628);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_608.deleter.m_deviceIface;
  data_05.object.m_internal = local_608.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_608.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_608.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_608.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_608.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5e8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_628);
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_580);
  VVar1.m_internal = pHVar21->m_internal;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_4f8);
  writeUniformConstantsBarrier.size = pHVar22->m_internal;
  makeComputePipeline(&local_698,vk_00,device_00,VVar1,
                      (VkShaderModule)writeUniformConstantsBarrier.size);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_678,(Move *)&local_698);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_678.deleter.m_deviceIface;
  data_06.object.m_internal = local_678.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_678.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_678.deleter.m_device;
  data_06.deleter.m_allocator._0_4_ = (int)local_678.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_678.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_658,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_698);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_190);
  betweenShadersBarrier.size = pVVar16->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_6e0,0x4000,8,(VkBuffer)betweenShadersBarrier.size,0,4);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_80);
  afterComputeBarrier.size = pVVar16->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_720,0x40,0x20,(VkBuffer)afterComputeBarrier.size,0,
             (VkDeviceSize)
             workBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_f8);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar16->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_760,0x40,0x2000,
             (VkBuffer)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0,4);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_7a8,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_7a8.deleter.m_deviceIface;
  data_07.object.m_internal = local_7a8.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_7a8.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device = local_7a8.deleter.m_device;
  data_07.deleter.m_allocator._0_4_ = (int)local_7a8.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_7a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_788,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_788);
  ::vk::allocateCommandBuffer
            (&local_828,vk_00,device_00,(VkCommandPool)pHVar23->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_808,(Move *)&local_828);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_808.deleter.m_deviceIface;
  data_08.object = local_808.object;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_808.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device = local_808.deleter.m_device;
  data_08.deleter.m_pool.m_internal._0_4_ = (int)local_808.deleter.m_pool.m_internal;
  data_08.deleter.m_pool.m_internal._4_4_ = (int)(local_808.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_7e8,data_08);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_828);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  beginCommandBuffer(vk_00,*ppVVar24);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  pVVar2 = *ppVVar24;
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_5e8);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,1,pHVar25->m_internal);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  pVVar2 = *ppVVar24;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_580);
  dVar3 = pHVar21->m_internal;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_328);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar2,1,dVar3,0,1,pHVar17,0,0);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar24,0x4000,1,0,0,0,1,local_6e0,0,0);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  pVVar2 = *ppVVar24;
  pIVar28 = &this->m_workSize;
  uVar5 = tcu::Vector<int,_3>::x(pIVar28);
  uVar6 = tcu::Vector<int,_3>::y(pIVar28);
  uVar7 = tcu::Vector<int,_3>::z(pIVar28);
  (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar2,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar24,0x800,0x800,0,0,0,1,local_720,0,0);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  pVVar2 = *ppVVar24;
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_658);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,1,pHVar25->m_internal);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  pVVar2 = *ppVVar24;
  pIVar28 = &this->m_workSize;
  uVar5 = tcu::Vector<int,_3>::x(pIVar28);
  uVar6 = tcu::Vector<int,_3>::y(pIVar28);
  uVar7 = tcu::Vector<int,_3>::z(pIVar28);
  (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar2,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar24,0x800,0x4000,0,0,0,1,local_760,0,0);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  endCommandBuffer(vk_00,*ppVVar24);
  ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_7e8);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar24);
  pAVar8 = compute::Buffer::getAllocation((Buffer *)local_f8);
  VVar10 = ::vk::Allocation::getMemory(pAVar8);
  VVar11 = ::vk::Allocation::getOffset(pAVar8);
  ::vk::invalidateMappedMemoryRange(vk_00,device_00,VVar10,VVar11,4);
  puVar26 = (uint *)::vk::Allocation::getHostPtr(pAVar8);
  uVar5 = *puVar26;
  local_868 = 0;
  for (local_86c = 0; local_86c < iVar4; local_86c = local_86c + 1) {
    local_868 = local_86c + 0x7f + local_868;
  }
  if (uVar5 == local_868) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a30,"Compute succeeded",&local_a31);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_a30);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator(&local_a31);
    local_a0c = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_9e8);
    poVar27 = std::operator<<((ostream *)local_9e8,"ERROR: comparison failed, expected ");
    poVar27 = (ostream *)std::ostream::operator<<(poVar27,local_868);
    poVar27 = std::operator<<(poVar27,", got ");
    std::ostream::operator<<(poVar27,uVar5);
    std::__cxx11::ostringstream::str();
    tcu::TestStatus::fail(__return_storage_ptr__,&local_a08);
    std::__cxx11::string::~string((string *)&local_a08);
    local_a0c = 1;
    std::__cxx11::ostringstream::~ostringstream(local_9e8);
  }
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_7e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_788);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_658);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_580);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_4f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_470);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_328);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_2b0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_208);
  compute::Buffer::~Buffer((Buffer *)local_190);
  compute::Buffer::~Buffer((Buffer *)local_f8);
  compute::Buffer::~Buffer((Buffer *)local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SSBOBarrierTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create a work buffer used by both shaders

	const int workGroupCount = multiplyComponents(m_workSize);
	const VkDeviceSize workBufferSizeBytes = sizeof(deUint32) * workGroupCount;
	const Buffer workBuffer(vk, device, allocator, makeBufferCreateInfo(workBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::Any);

	// Create an output buffer

	const VkDeviceSize outputBufferSizeBytes = sizeof(deUint32);
	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(outputBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Initialize atomic counter value to zero
	{
		const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
		deUint32* outputBufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
		*outputBufferPtr = 0;
		flushMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);
	}

	// Create a uniform buffer (to pass uniform constants)

	const VkDeviceSize uniformBufferSizeBytes = sizeof(deUint32);
	const Buffer uniformBuffer(vk, device, allocator, makeBufferCreateInfo(uniformBufferSizeBytes, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Set the constants in the uniform buffer

	const deUint32	baseValue = 127;
	{
		const Allocation& uniformBufferAllocation = uniformBuffer.getAllocation();
		deUint32* uniformBufferPtr = static_cast<deUint32*>(uniformBufferAllocation.getHostPtr());
		uniformBufferPtr[0] = baseValue;

		flushMappedMemoryRange(vk, device, uniformBufferAllocation.getMemory(), uniformBufferAllocation.getOffset(), uniformBufferSizeBytes);
	}

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u)
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo workBufferDescriptorInfo = makeDescriptorBufferInfo(*workBuffer, 0ull, workBufferSizeBytes);
	const VkDescriptorBufferInfo outputBufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, outputBufferSizeBytes);
	const VkDescriptorBufferInfo uniformBufferDescriptorInfo = makeDescriptorBufferInfo(*uniformBuffer, 0ull, uniformBufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &outputBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &workBufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(2u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &uniformBufferDescriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule0(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp0"), 0));
	const Unique<VkShaderModule> shaderModule1(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp1"), 0));

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline0(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule0));
	const Unique<VkPipeline> pipeline1(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule1));

	const VkBufferMemoryBarrier writeUniformConstantsBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_UNIFORM_READ_BIT, *uniformBuffer, 0ull, uniformBufferSizeBytes);

	const VkBufferMemoryBarrier betweenShadersBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *workBuffer, 0ull, workBufferSizeBytes);

	const VkBufferMemoryBarrier afterComputeBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, outputBufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline0);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &writeUniformConstantsBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &betweenShadersBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	// Switch to the second shader program
	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline1);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &afterComputeBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32	res = *bufferPtr;
	deUint32		ref = 0;

	for (int ndx = 0; ndx < workGroupCount; ++ndx)
		ref += baseValue + ndx;

	if (res != ref)
	{
		std::ostringstream msg;
		msg << "ERROR: comparison failed, expected " << ref << ", got " << res;
		return tcu::TestStatus::fail(msg.str());
	}
	return tcu::TestStatus::pass("Compute succeeded");
}